

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_smooth.c
# Opt level: O3

REF_STATUS ref_smooth_tet_quality_around(REF_GRID ref_grid,REF_INT node,REF_DBL *min_quality)

{
  REF_NODE ref_node;
  REF_CELL ref_cell;
  REF_ADJ pRVar1;
  REF_ADJ_ITEM pRVar2;
  uint uVar3;
  undefined8 uVar4;
  char *pcVar5;
  long lVar6;
  double dVar7;
  REF_DBL quality;
  REF_INT nodes [27];
  double local_b0;
  REF_INT local_a8 [30];
  
  ref_node = ref_grid->node;
  ref_cell = ref_grid->cell[8];
  *min_quality = 1.0;
  if (((node < 0) || (pRVar1 = ref_cell->ref_adj, pRVar1->nnode <= node)) ||
     (lVar6 = (long)pRVar1->first[(uint)node], lVar6 == -1)) {
    *min_quality = -2.0;
    uVar3 = 5;
  }
  else {
    uVar3 = ref_cell_nodes(ref_cell,pRVar1->item[lVar6].ref,local_a8);
    if (uVar3 == 0) {
      do {
        uVar3 = ref_node_tet_quality(ref_node,local_a8,&local_b0);
        if (uVar3 != 0) {
          pcVar5 = "qual";
          uVar4 = 0x4ee;
          goto LAB_001df4cc;
        }
        dVar7 = *min_quality;
        if (local_b0 <= *min_quality) {
          dVar7 = local_b0;
        }
        *min_quality = dVar7;
        pRVar2 = ref_cell->ref_adj->item;
        lVar6 = (long)pRVar2[(int)lVar6].next;
        if (lVar6 == -1) {
          return 0;
        }
        uVar3 = ref_cell_nodes(ref_cell,pRVar2[lVar6].ref,local_a8);
      } while (uVar3 == 0);
    }
    pcVar5 = "nodes";
    uVar4 = 0x4ec;
LAB_001df4cc:
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",uVar4,
           "ref_smooth_tet_quality_around",(ulong)uVar3,pcVar5);
  }
  return uVar3;
}

Assistant:

REF_FCN REF_STATUS ref_smooth_tet_quality_around(REF_GRID ref_grid,
                                                 REF_INT node,
                                                 REF_DBL *min_quality) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell = ref_grid_tet(ref_grid);
  REF_INT item, cell;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_BOOL none_found = REF_TRUE;
  REF_DBL quality;

  *min_quality = 1.0;
  each_ref_cell_having_node(ref_cell, node, item, cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "nodes");
    none_found = REF_FALSE;
    RSS(ref_node_tet_quality(ref_node, nodes, &quality), "qual");
    *min_quality = MIN(*min_quality, quality);
  }

  if (none_found) {
    *min_quality = -2.0;
    return REF_NOT_FOUND;
  }

  return REF_SUCCESS;
}